

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O1

pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<MiniSTOptions>::insert_simplex_raw<std::vector<short,std::allocator<short>>>
          (Simplex_tree<MiniSTOptions> *this,vector<short,_std::allocator<short>_> *simplex,
          Filtration_value *filtration)

{
  undefined8 *puVar1;
  Vertex_handle v;
  uint uVar2;
  pointer *ppsVar3;
  ulong uVar4;
  short *psVar5;
  pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_false>,_bool>
  pVar6;
  pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_bool>
  pVar7;
  __buckets_ptr local_40;
  char local_38;
  
  ppsVar3 = &simplex[2].super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  v = (Vertex_handle)ppsVar3;
  psVar5 = (short *)*filtration;
  if (psVar5 != (short *)((long)filtration[1] + -2)) {
    do {
      if (*psVar5 ==
          *(short *)&simplex[2].super__Vector_base<short,_std::allocator<short>_>._M_impl.
                     super__Vector_impl_data._M_finish) goto LAB_00117515;
      insert_node_<false,true,false,double_const&>
                ((Simplex_tree<MiniSTOptions> *)&stack0xffffffffffffffc0,(Siblings *)simplex,
                 (Vertex_handle)ppsVar3,(double *)(ulong)(uint)(int)*psVar5);
      ppsVar3 = (pointer *)local_40[2];
      v = (Vertex_handle)ppsVar3;
      psVar5 = psVar5 + 1;
    } while (psVar5 != (short *)((long)filtration[1] + -2));
  }
  if (*psVar5 !=
      *(short *)&simplex[2].super__Vector_base<short,_std::allocator<short>_>._M_impl.
                 super__Vector_impl_data._M_finish) {
    pVar6 = insert_node_<true,false,true,double_const&>
                      ((Simplex_tree<MiniSTOptions> *)&stack0xffffffffffffffc0,(Siblings *)simplex,v
                       ,(double *)(ulong)(uint)(int)*psVar5);
    uVar4 = pVar6._8_8_;
    if (local_38 == '\x01') {
      uVar2 = (int)((ulong)((long)filtration[1] - (long)*filtration) >> 1) - 1;
      uVar4 = (ulong)uVar2;
      if (*(int *)&simplex[5].super__Vector_base<short,_std::allocator<short>_>._M_impl.
                   super__Vector_impl_data._M_finish < (int)uVar2) {
        *(uint *)&simplex[5].super__Vector_base<short,_std::allocator<short>_>._M_impl.
                  super__Vector_impl_data._M_finish = uVar2;
      }
    }
    (this->nodes_label_to_list_)._M_h._M_buckets = local_40;
    *(char *)&(this->nodes_label_to_list_)._M_h._M_bucket_count = local_38;
    pVar7._8_8_ = uVar4;
    pVar7.first.m_ptr =
         (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>
          *)this;
    return pVar7;
  }
LAB_00117515:
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = "cannot use the dummy null_vertex() as a real vertex";
  __cxa_throw(puVar1,&char_const*::typeinfo,0);
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex_raw(const RandomVertexHandleRange& simplex,
                                                     const Filtration_value& filtration) {
    Siblings * curr_sib = &root_;
    std::pair<Dictionary_it, bool> res_insert;
    auto vi = simplex.begin();

    for (; vi != std::prev(simplex.end()); ++vi) {
      GUDHI_CHECK(*vi != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
      res_insert = insert_node_<false, true, false>(curr_sib, *vi, filtration);
      curr_sib = res_insert.first->second.children();
    }

    GUDHI_CHECK(*vi != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
    res_insert = insert_node_<true, false, true>(curr_sib, *vi, filtration);
    if (res_insert.second){
      int dim = static_cast<int>(boost::size(simplex)) - 1;
      if (dim > dimension_) {
        // Update dimension if needed
        dimension_ = dim;
      }
    }
    return res_insert;
  }